

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O2

void counting_loop_try_mu(test_data *td,int id)

{
  int iVar1;
  int iVar2;
  
  iVar1 = td->loop_count;
  for (iVar2 = 0; iVar2 != iVar1; iVar2 = iVar2 + 1) {
    while( true ) {
      iVar1 = nsync::nsync_mu_trylock(&td->mu);
      if (iVar1 != 0) break;
      sched_yield();
    }
    td->id = id;
    td->i = td->i + 1;
    if (td->id != id) {
      testing_panic("td->id != id");
    }
    iVar1 = td->loop_count;
    nsync::nsync_mu_unlock(&td->mu);
  }
  test_data_thread_finished(td);
  return;
}

Assistant:

static void counting_loop_try_mu (test_data *td, int id) {
	int i;
	int n = td->loop_count;
	for (i = 0; i != n; i++) {
		while (!nsync_mu_trylock (&td->mu)) {
			sched_yield ();
		}
		td->id = id;
		td->i++;
		if (td->id != id) {
			testing_panic ("td->id != id");
		}
		n = td->loop_count;
		nsync_mu_unlock (&td->mu);
	}
	test_data_thread_finished (td);
}